

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cpp
# Opt level: O0

void applyPatches(Section *section,void *arg)

{
  bool bVar1;
  Section *dataSection;
  void *arg_local;
  Section *section_local;
  
  bVar1 = sect_HasData(section->type);
  arg_local = section;
  if (bVar1) {
    do {
      applyFilePatches((Section *)arg_local,section);
      arg_local = *(void **)((long)arg_local + 0x58);
    } while (arg_local != (void *)0x0);
  }
  return;
}

Assistant:

static void applyPatches(struct Section *section, void *arg)
{
	if (!sect_HasData(section->type))
		return;

	(void)arg;
	struct Section *dataSection = section;

	do {
		applyFilePatches(section, dataSection);
		section = section->nextu;
	} while (section);
}